

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_csr.c
# Opt level: O3

int mbedtls_x509write_csr_pem
              (mbedtls_x509write_csr *ctx,uchar *buf,size_t size,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  uint uVar1;
  size_t olen;
  uchar output_buf [4096];
  size_t local_1020;
  uchar local_1018 [4096];
  
  local_1020 = 0;
  uVar1 = mbedtls_x509write_csr_der(ctx,local_1018,0x1000,f_rng,p_rng);
  if (-1 < (int)uVar1) {
    uVar1 = mbedtls_pem_write_buffer
                      ("-----BEGIN CERTIFICATE REQUEST-----\n","-----END CERTIFICATE REQUEST-----\n"
                       ,&stack0xffffffffffffffe8 + -(ulong)uVar1,(ulong)uVar1,buf,size,&local_1020);
  }
  return uVar1;
}

Assistant:

int mbedtls_x509write_csr_pem( mbedtls_x509write_csr *ctx, unsigned char *buf, size_t size,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng )
{
    int ret;
    unsigned char output_buf[4096];
    size_t olen = 0;

    if( ( ret = mbedtls_x509write_csr_der( ctx, output_buf, sizeof(output_buf),
                                   f_rng, p_rng ) ) < 0 )
    {
        return( ret );
    }

    if( ( ret = mbedtls_pem_write_buffer( PEM_BEGIN_CSR, PEM_END_CSR,
                                  output_buf + sizeof(output_buf) - ret,
                                  ret, buf, size, &olen ) ) != 0 )
    {
        return( ret );
    }

    return( 0 );
}